

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkparse.c
# Opt level: O3

int pk_use_ecparams(mbedtls_asn1_buf *params,mbedtls_ecp_group *grp)

{
  mbedtls_ecp_group_id *pmVar1;
  mbedtls_mpi *X;
  long lVar2;
  int iVar3;
  int iVar4;
  mbedtls_ecp_group_id *pmVar5;
  mbedtls_ecp_group_id *pmVar6;
  size_t sVar7;
  byte *pbVar8;
  mbedtls_ecp_group_id id;
  byte *end;
  mbedtls_ecp_group_id grp_id;
  uchar *p;
  mbedtls_ecp_group_id local_248;
  undefined4 uStack_244;
  int local_240;
  int local_23c;
  mbedtls_mpi *local_238;
  mbedtls_mpi *local_230;
  mbedtls_mpi *local_228;
  mbedtls_ecp_group local_220;
  mbedtls_ecp_group local_128;
  
  if (params->tag == 6) {
    iVar3 = mbedtls_oid_get_ec_grp(params,&local_248);
    iVar4 = -0x3a00;
    id = local_248;
joined_r0x0013dcd3:
    if ((iVar3 == 0) && ((grp->id == MBEDTLS_ECP_DP_NONE || (iVar4 = -0x3d00, grp->id == id)))) {
      iVar4 = mbedtls_ecp_group_load(grp,id);
    }
  }
  else {
    mbedtls_ecp_group_init(&local_128);
    local_220._0_8_ = params->p;
    end = (byte *)(local_220._0_8_ + params->len);
    iVar3 = mbedtls_asn1_get_int((uchar **)&local_220,end,&local_23c);
    if (iVar3 != 0) goto LAB_0013dd1a;
    if (local_23c - 4U < 0xfffffffd) {
LAB_0013de84:
      iVar4 = -0x3d00;
    }
    else {
      iVar4 = mbedtls_asn1_get_tag((uchar **)&local_220,end,(size_t *)&local_248,0x30);
      if (iVar4 == 0) {
        pbVar8 = (byte *)(local_220._0_8_ + CONCAT44(uStack_244,local_248));
        iVar4 = mbedtls_asn1_get_tag((uchar **)&local_220,pbVar8,(size_t *)&local_248,6);
        if (((iVar4 == 0) && (iVar4 = -0x3980, CONCAT44(uStack_244,local_248) == 7)) &&
           (*(int *)(local_220._0_8_ + 3) == 0x1013dce && *(int *)local_220._0_8_ == -0x31b779d6)) {
          local_220._0_8_ = local_220._0_8_ + 7;
          X = &local_128.P;
          iVar3 = mbedtls_asn1_get_mpi((uchar **)&local_220,pbVar8,X);
          if (iVar3 != 0) goto LAB_0013dd1a;
          local_128.pbits = mbedtls_mpi_bitlen(X);
          iVar4 = -0x3d66;
          if (((byte *)local_220._0_8_ != pbVar8) ||
             (iVar4 = mbedtls_asn1_get_tag((uchar **)&local_220,end,(size_t *)&local_248,0x30),
             iVar4 != 0)) goto LAB_0013dec5;
          pbVar8 = (byte *)(local_220._0_8_ + CONCAT44(uStack_244,local_248));
          iVar3 = mbedtls_asn1_get_tag((uchar **)&local_220,pbVar8,(size_t *)&local_248,4);
          if ((iVar3 == 0) &&
             (iVar3 = mbedtls_mpi_read_binary
                                (&local_128.A,(uchar *)local_220._0_8_,
                                 CONCAT44(uStack_244,local_248)), iVar3 == 0)) {
            local_220._0_8_ = local_220._0_8_ + CONCAT44(uStack_244,local_248);
            iVar3 = mbedtls_asn1_get_tag((uchar **)&local_220,pbVar8,(size_t *)&local_248,4);
            if ((iVar3 != 0) ||
               (iVar3 = mbedtls_mpi_read_binary
                                  (&local_128.B,(uchar *)local_220._0_8_,
                                   CONCAT44(uStack_244,local_248)), iVar3 != 0)) goto LAB_0013dd1a;
            local_220._0_8_ = local_220._0_8_ + CONCAT44(uStack_244,local_248);
            iVar4 = mbedtls_asn1_get_tag((uchar **)&local_220,pbVar8,(size_t *)&local_248,3);
            if (iVar4 == 0) {
              local_220._0_8_ = local_220._0_8_ + CONCAT44(uStack_244,local_248);
            }
            iVar4 = -0x3d66;
            if ((byte *)local_220._0_8_ != pbVar8) goto LAB_0013dec5;
            iVar3 = mbedtls_asn1_get_tag((uchar **)&local_220,end,(size_t *)&local_248,4);
            if (iVar3 != 0) goto LAB_0013dd1a;
            iVar4 = mbedtls_ecp_point_read_binary
                              (&local_128,&local_128.G,(uchar *)local_220._0_8_,
                               CONCAT44(uStack_244,local_248));
            if (iVar4 != 0) {
              if ((((iVar4 != -0x4e80) || ((*(byte *)local_220._0_8_ & 0xfe) != 2)) ||
                  (lVar2 = CONCAT44(uStack_244,local_248), sVar7 = mbedtls_mpi_size(X),
                  lVar2 != sVar7 + 1)) ||
                 ((iVar4 = mbedtls_mpi_read_binary
                                     (&local_128.G.X,(byte *)(local_220._0_8_ + 1),
                                      CONCAT44(uStack_244,local_248) - 1), iVar4 != 0 ||
                  (iVar4 = mbedtls_mpi_lset(&local_128.G.Y,(ulong)*(byte *)local_220._0_8_ - 2),
                  iVar4 != 0)))) goto LAB_0013de84;
              iVar3 = mbedtls_mpi_lset(&local_128.G.Z,1);
              iVar4 = -0x3d00;
              if (iVar3 != 0) goto LAB_0013dec5;
            }
            local_220._0_8_ = local_220._0_8_ + CONCAT44(uStack_244,local_248);
            iVar3 = mbedtls_asn1_get_mpi((uchar **)&local_220,end,&local_128.N);
            if (iVar3 != 0) goto LAB_0013dd1a;
            local_128.nbits = mbedtls_mpi_bitlen(&local_128.N);
LAB_0013dd28:
            mbedtls_ecp_group_init(&local_220);
            pmVar5 = mbedtls_ecp_grp_id_list();
            if (*pmVar5 != MBEDTLS_ECP_DP_NONE) {
              local_230 = &local_128.N;
              local_228 = &local_220.N;
              local_238 = &local_220.G.Z;
              pmVar6 = pmVar5;
              do {
                mbedtls_ecp_group_free(&local_220);
                iVar3 = mbedtls_ecp_group_load(&local_220,*pmVar6);
                if (iVar3 != 0) goto LAB_0013ded7;
                if ((((local_128.pbits == local_220.pbits) && (local_128.nbits == local_220.nbits))
                    && ((iVar4 = mbedtls_mpi_cmp_mpi(&local_128.P,
                                                     (mbedtls_mpi *)((long)&local_220 + 8)),
                        iVar4 == 0 &&
                        (((iVar4 = mbedtls_mpi_cmp_mpi(&local_128.A,&local_220.A), iVar4 == 0 &&
                          (iVar4 = mbedtls_mpi_cmp_mpi(&local_128.B,&local_220.B), iVar4 == 0)) &&
                         (iVar4 = mbedtls_mpi_cmp_mpi(local_230,local_228), iVar4 == 0)))))) &&
                   ((iVar4 = mbedtls_mpi_cmp_mpi(&local_128.G.X,&local_220.G.X), iVar4 == 0 &&
                    (iVar4 = mbedtls_mpi_cmp_mpi(&local_128.G.Z,local_238), iVar4 == 0)))) {
                  iVar3 = 0;
                  local_240 = mbedtls_mpi_get_bit(&local_128.G.Y,0);
                  iVar4 = mbedtls_mpi_get_bit(&local_220.G.Y,0);
                  if (local_240 == iVar4) goto LAB_0013ded7;
                }
                pmVar5 = pmVar6 + 1;
                pmVar1 = pmVar6 + 1;
                pmVar6 = pmVar5;
              } while (*pmVar1 != MBEDTLS_ECP_DP_NONE);
            }
            iVar3 = 0;
            pmVar6 = pmVar5;
LAB_0013ded7:
            mbedtls_ecp_group_free(&local_220);
            local_248 = *pmVar6;
            end = (byte *)(ulong)local_248;
            iVar4 = 0;
            if (local_248 == MBEDTLS_ECP_DP_NONE) {
              iVar4 = -0x4e80;
            }
            if (iVar3 != 0) {
              iVar4 = iVar3;
            }
          }
          else {
LAB_0013dd1a:
            iVar4 = iVar3 + -0x3d00;
            if (iVar3 + -0x3d00 == 0) goto LAB_0013dd28;
          }
          id = (mbedtls_ecp_group_id)end;
          mbedtls_ecp_group_free(&local_128);
          iVar3 = iVar4;
          goto joined_r0x0013dcd3;
        }
      }
    }
LAB_0013dec5:
    mbedtls_ecp_group_free(&local_128);
  }
  return iVar4;
}

Assistant:

static int pk_use_ecparams( const mbedtls_asn1_buf *params, mbedtls_ecp_group *grp )
{
    int ret;
    mbedtls_ecp_group_id grp_id;

    if( params->tag == MBEDTLS_ASN1_OID )
    {
        if( mbedtls_oid_get_ec_grp( params, &grp_id ) != 0 )
            return( MBEDTLS_ERR_PK_UNKNOWN_NAMED_CURVE );
    }
    else
    {
#if defined(MBEDTLS_PK_PARSE_EC_EXTENDED)
        if( ( ret = pk_group_id_from_specified( params, &grp_id ) ) != 0 )
            return( ret );
#else
        return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT );
#endif
    }

    /*
     * grp may already be initilialized; if so, make sure IDs match
     */
    if( grp->id != MBEDTLS_ECP_DP_NONE && grp->id != grp_id )
        return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT );

    if( ( ret = mbedtls_ecp_group_load( grp, grp_id ) ) != 0 )
        return( ret );

    return( 0 );
}